

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O2

void tsgMakeGlobalGrid(void *grid,int dimensions,int outputs,int depth,char *sType,char *sRule,
                      int *anisotropic_weights,double alpha,double beta,char *custom_filename,
                      int *limit_levels)

{
  TypeDepth type;
  TypeOneDRule rule;
  ostream *poVar1;
  allocator<char> local_69;
  TasmanianSparseGrid *local_68;
  double local_60;
  double local_58;
  string local_50;
  
  local_68 = (TasmanianSparseGrid *)grid;
  local_60 = alpha;
  local_58 = beta;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,sType,&local_69);
  type = TasGrid::IO::getDepthTypeString(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,sRule,&local_69);
  rule = TasGrid::IO::getRuleString(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (type == type_none) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect depth type: ");
    poVar1 = std::operator<<(poVar1,sType);
    poVar1 = std::operator<<(poVar1,", defaulting to type_iptotal.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (rule == rule_none) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect rule type: ");
    poVar1 = std::operator<<(poVar1,sType);
    poVar1 = std::operator<<(poVar1,", defaulting to clenshaw-curtis.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  TasGrid::TasmanianSparseGrid::makeGlobalGrid
            (local_68,dimensions,outputs,depth,type,rule,anisotropic_weights,local_60,local_58,
             custom_filename,limit_levels);
  return;
}

Assistant:

void tsgMakeGlobalGrid(void *grid, int dimensions, int outputs, int depth, const char * sType, const char *sRule, const int *anisotropic_weights, double alpha, double beta, const char* custom_filename, const int *limit_levels){
    TypeDepth depth_type = IO::getDepthTypeString(sType);
    TypeOneDRule rule = IO::getRuleString(sRule);
    #ifndef NDEBUG
    if (depth_type == type_none){ cerr << "WARNING: incorrect depth type: " << sType << ", defaulting to type_iptotal." << endl; }
    if (rule == rule_none){ cerr << "WARNING: incorrect rule type: " << sType << ", defaulting to clenshaw-curtis." << endl; }
    #endif // NDEBUG
    ((TasmanianSparseGrid*) grid)->makeGlobalGrid(dimensions, outputs, depth, depth_type, rule, anisotropic_weights, alpha, beta, custom_filename, limit_levels);
}